

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayoutPrivate::addHfwData(QGridLayoutPrivate *this,QGridBox *box,int width)

{
  int iVar1;
  QList<QLayoutStruct> *this_00;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  pointer pQVar5;
  int extraout_var;
  int extraout_var_00;
  long lVar6;
  
  this_00 = this->hfwData;
  iVar3 = (*box->item_->_vptr_QLayoutItem[9])();
  pp_Var2 = box->item_->_vptr_QLayoutItem;
  if ((char)iVar3 == '\0') {
    (*pp_Var2[2])();
    (*box->item_->_vptr_QLayoutItem[3])();
    iVar3 = box->row;
    iVar1 = (this_00->d).ptr[iVar3].sizeHint;
    iVar4 = extraout_var;
    if (extraout_var < iVar1) {
      iVar4 = iVar1;
    }
    pQVar5 = QList<QLayoutStruct>::data(this_00);
    pQVar5[iVar3].sizeHint = iVar4;
    lVar6 = (long)box->row;
    iVar1 = (this_00->d).ptr[lVar6].minimumSize;
    iVar3 = extraout_var_00;
    if (extraout_var_00 < iVar1) {
      iVar3 = iVar1;
    }
  }
  else {
    iVar4 = (*pp_Var2[10])(box->item_,(ulong)(uint)width);
    iVar3 = box->row;
    iVar1 = (this_00->d).ptr[iVar3].sizeHint;
    if (iVar1 < iVar4) {
      iVar1 = iVar4;
    }
    pQVar5 = QList<QLayoutStruct>::data(this_00);
    pQVar5[iVar3].sizeHint = iVar1;
    lVar6 = (long)box->row;
    iVar3 = (this_00->d).ptr[lVar6].minimumSize;
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
  }
  pQVar5 = QList<QLayoutStruct>::data(this_00);
  pQVar5[lVar6].minimumSize = iVar3;
  return;
}

Assistant:

void QGridLayoutPrivate::addHfwData(QGridBox *box, int width)
{
    QList<QLayoutStruct> &rData = *hfwData;
    if (box->hasHeightForWidth()) {
        int hint = box->heightForWidth(width);
        rData[box->row].sizeHint = qMax(hint, rData.at(box->row).sizeHint);
        rData[box->row].minimumSize = qMax(hint, rData.at(box->row).minimumSize);
    } else {
        QSize hint = box->sizeHint();
        QSize minS = box->minimumSize();
        rData[box->row].sizeHint = qMax(hint.height(), rData.at(box->row).sizeHint);
        rData[box->row].minimumSize = qMax(minS.height(), rData.at(box->row).minimumSize);
    }
}